

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O1

void __thiscall libtorrent::dht::dht_tracker::new_socket(dht_tracker *this,listen_socket_handle *s)

{
  int *piVar1;
  dht_observer *pdVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
  _Var6;
  tuple<boost::asio::io_context_&,_const_libtorrent::aux::listen_socket_handle_&,_libtorrent::dht::dht_tracker_*&&,_const_libtorrent::aux::session_settings_&,_const_libtorrent::digest32<160L>_&,_libtorrent::dht::dht_observer_*&,_libtorrent::counters_&,_std::_Bind<libtorrent::dht::node_*(libtorrent::dht::dht_tracker::*(libtorrent::dht::dht_tracker_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_libtorrent::digest32<160L>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>_&&,_libtorrent::dht::dht_storage_interface_&>
  *__args_2;
  long lVar7;
  __normal_iterator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_*,_std::vector<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>_>
  _Var8;
  pair<boost::asio::ip::address,_libtorrent::digest32<160L>_> *ppVar9;
  __normal_iterator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_*,_std::vector<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>_>
  __it;
  __normal_iterator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_*,_std::vector<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>_>
  __it_00;
  pair<std::_Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>,_bool>
  pVar10;
  span<const_char> in;
  address local_address;
  node_id nid;
  piecewise_construct_t local_f9;
  pair<boost::asio::ip::address,_libtorrent::digest32<160L>_> *local_f8;
  listen_socket_handle *local_f0;
  undefined1 local_e8 [32];
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Head_base<4UL,_const_libtorrent::digest32<160L>_&,_false> local_a8;
  _Head_base<3UL,_const_libtorrent::aux::session_settings_&,_false> _Stack_a0;
  _Head_base<2UL,_libtorrent::dht::dht_tracker_*&&,_false> local_98;
  _Head_base<1UL,_const_libtorrent::aux::listen_socket_handle_&,_false> local_90;
  _Head_base<0UL,_boost::asio::io_context_&,_false> local_88;
  address local_78;
  digest32<160L> local_58;
  dht_tracker *local_40;
  _Head_base<0UL,_const_libtorrent::aux::listen_socket_handle_&,_false> local_38;
  
  aux::listen_socket_handle::get_local_endpoint((endpoint *)local_c8,s);
  if (local_c8._0_2_ == 2) {
    local_78._0_8_ = local_c8._0_8_ & 0xffffffff00000000;
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = '\0';
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = '\0';
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = '\0';
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = '\0';
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = '\0';
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = '\0';
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = '\0';
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = '\0';
    local_78.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    local_78.ipv6_address_.scope_id_ = 0;
  }
  else {
    local_78.ipv6_address_.addr_.__in6_u._0_8_ = local_c8._8_8_;
    local_78.ipv6_address_.addr_.__in6_u._8_8_ = local_b8._M_allocated_capacity;
    local_78.ipv6_address_.scope_id_ = local_b8._8_8_ & 0xffffffff;
    local_78.type_ = ipv6;
    local_78.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
  }
  __it._M_current =
       (this->m_state).nids.
       super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  ppVar9 = (this->m_state).nids.
           super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_c8._0_8_ = &local_78;
  lVar7 = ((long)ppVar9 - (long)__it._M_current >> 3) * 0x6db6db6db6db6db7 >> 2;
  __it_00._M_current = __it._M_current;
  if (0 < lVar7) {
    __it_00._M_current = __it._M_current + lVar7 * 4;
    lVar7 = lVar7 + 1;
    local_f8 = ppVar9;
    local_f0 = s;
    do {
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::dht::dht_tracker::new_socket(libtorrent::aux::listen_socket_handle_const&)::$_0>
              ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_kademlia_dht_tracker_cpp:104:6)>
                            *)local_c8,__it);
      _Var8._M_current = __it._M_current;
      ppVar9 = local_f8;
      s = local_f0;
      if (bVar4) goto LAB_003b9d2d;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::dht::dht_tracker::new_socket(libtorrent::aux::listen_socket_handle_const&)::$_0>
              ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_kademlia_dht_tracker_cpp:104:6)>
                            *)local_c8,__it._M_current + 1);
      _Var8._M_current = __it._M_current + 1;
      ppVar9 = local_f8;
      s = local_f0;
      if (bVar4) goto LAB_003b9d2d;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::dht::dht_tracker::new_socket(libtorrent::aux::listen_socket_handle_const&)::$_0>
              ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_kademlia_dht_tracker_cpp:104:6)>
                            *)local_c8,__it._M_current + 2);
      _Var8._M_current = __it._M_current + 2;
      ppVar9 = local_f8;
      s = local_f0;
      if (bVar4) goto LAB_003b9d2d;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::dht::dht_tracker::new_socket(libtorrent::aux::listen_socket_handle_const&)::$_0>
              ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_kademlia_dht_tracker_cpp:104:6)>
                            *)local_c8,__it._M_current + 3);
      _Var8._M_current = __it._M_current + 3;
      ppVar9 = local_f8;
      s = local_f0;
      if (bVar4) goto LAB_003b9d2d;
      __it._M_current = __it._M_current + 4;
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  lVar7 = ((long)ppVar9 - (long)__it_00._M_current >> 3) * 0x6db6db6db6db6db7;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      _Var8._M_current = ppVar9;
      if ((lVar7 != 3) ||
         (bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<libtorrent::dht::dht_tracker::new_socket(libtorrent::aux::listen_socket_handle_const&)::$_0>
                  ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_kademlia_dht_tracker_cpp:104:6)>
                                *)local_c8,__it_00), _Var8._M_current = __it_00._M_current, bVar4))
      goto LAB_003b9d2d;
      __it_00._M_current = __it_00._M_current + 1;
    }
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::dht::dht_tracker::new_socket(libtorrent::aux::listen_socket_handle_const&)::$_0>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_kademlia_dht_tracker_cpp:104:6)>
                          *)local_c8,__it_00);
    _Var8._M_current = __it_00._M_current;
    if (bVar4) goto LAB_003b9d2d;
    __it_00._M_current = __it_00._M_current + 1;
  }
  bVar4 = __gnu_cxx::__ops::
          _Iter_pred<libtorrent::dht::dht_tracker::new_socket(libtorrent::aux::listen_socket_handle_const&)::$_0>
          ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_kademlia_dht_tracker_cpp:104:6)>
                        *)local_c8,__it_00);
  _Var8._M_current = __it_00._M_current;
  if (!bVar4) {
    _Var8._M_current = ppVar9;
  }
LAB_003b9d2d:
  if (_Var8._M_current == ppVar9) {
    local_58.m_number._M_elems[0] = 0;
    local_58.m_number._M_elems[1] = 0;
    local_58.m_number._M_elems[2] = 0;
    local_58.m_number._M_elems[3] = 0;
    local_58.m_number._M_elems[4] = 0;
  }
  else {
    local_58.m_number._M_elems[4] = ((_Var8._M_current)->second).m_number._M_elems[4];
    local_58.m_number._M_elems._0_8_ = *(undefined8 *)((_Var8._M_current)->second).m_number._M_elems
    ;
    local_58.m_number._M_elems._8_8_ =
         *(undefined8 *)(((_Var8._M_current)->second).m_number._M_elems + 2);
  }
  local_88._M_head_impl = this->m_ioc;
  local_98._M_head_impl = &local_40;
  _Stack_a0._M_head_impl = this->m_settings;
  local_b8._M_allocated_capacity = (size_type)this->m_counters;
  local_c8._8_8_ = local_e8;
  local_e8._0_8_ = get_node;
  local_e8._8_8_ = (session_settings *)0x0;
  local_c8._0_8_ = this->m_storage;
  __args_2 = (tuple<boost::asio::io_context_&,_const_libtorrent::aux::listen_socket_handle_&,_libtorrent::dht::dht_tracker_*&&,_const_libtorrent::aux::session_settings_&,_const_libtorrent::digest32<160L>_&,_libtorrent::dht::dht_observer_*&,_libtorrent::counters_&,_std::_Bind<libtorrent::dht::node_*(libtorrent::dht::dht_tracker::*(libtorrent::dht::dht_tracker_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_libtorrent::digest32<160L>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>_&&,_libtorrent::dht::dht_storage_interface_&>
              *)local_c8;
  local_a8._M_head_impl = &local_58;
  local_e8._16_8_ = this;
  local_b8._8_8_ = &this->m_log;
  local_90._M_head_impl = s;
  local_40 = this;
  local_38._M_head_impl = s;
  pVar10 = ::std::
           _Rb_tree<libtorrent::aux::listen_socket_handle,std::pair<libtorrent::aux::listen_socket_handle_const,libtorrent::dht::dht_tracker::tracker_node>,std::_Select1st<std::pair<libtorrent::aux::listen_socket_handle_const,libtorrent::dht::dht_tracker::tracker_node>>,std::less<libtorrent::aux::listen_socket_handle>,std::allocator<std::pair<libtorrent::aux::listen_socket_handle_const,libtorrent::dht::dht_tracker::tracker_node>>>
           ::
           _M_emplace_unique<std::piecewise_construct_t,std::tuple<libtorrent::aux::listen_socket_handle_const&>,std::tuple<boost::asio::io_context&,libtorrent::aux::listen_socket_handle_const&,libtorrent::dht::dht_tracker*&&,libtorrent::aux::session_settings_const&,libtorrent::digest32<160l>const&,libtorrent::dht::dht_observer*&,libtorrent::counters&,std::_Bind<libtorrent::dht::node*(libtorrent::dht::dht_tracker::*(libtorrent::dht::dht_tracker*,std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::digest32<160l>const&,std::basic_string_view<char,std::char_traits<char>>)>&&,libtorrent::dht::dht_storage_interface&>>
                     ((_Rb_tree<libtorrent::aux::listen_socket_handle,std::pair<libtorrent::aux::listen_socket_handle_const,libtorrent::dht::dht_tracker::tracker_node>,std::_Select1st<std::pair<libtorrent::aux::listen_socket_handle_const,libtorrent::dht::dht_tracker::tracker_node>>,std::less<libtorrent::aux::listen_socket_handle>,std::allocator<std::pair<libtorrent::aux::listen_socket_handle_const,libtorrent::dht::dht_tracker::tracker_node>>>
                       *)&this->m_nodes,&local_f9,
                      (tuple<const_libtorrent::aux::listen_socket_handle_&> *)&local_38,__args_2);
  _Var6 = pVar10.first._M_node;
  update_storage_node_ids(this);
  iVar5 = (**(this->m_log->super_dht_logger)._vptr_dht_logger)(this->m_log,0);
  if ((char)iVar5 != '\0') {
    pdVar2 = this->m_log;
    boost::asio::ip::address::to_string_abi_cxx11_((string *)local_c8,&local_78);
    uVar3 = local_c8._0_8_;
    in.m_len = (difference_type)__args_2;
    in.m_ptr = (char *)0x14;
    aux::to_hex_abi_cxx11_((string *)local_e8,(aux *)&_Var6._M_node[4]._M_left,in);
    (*(pdVar2->super_dht_logger)._vptr_dht_logger[1])
              (pdVar2,0,"starting %s DHT tracker with node id: %s",uVar3,local_e8._0_8_);
    if ((digest32<160L> *)local_e8._0_8_ != (digest32<160L> *)(local_e8 + 0x10)) {
      operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
    }
    if ((dht_storage_interface *)local_c8._0_8_ != (dht_storage_interface *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,(ulong)(local_b8._M_allocated_capacity + 1));
    }
  }
  if ((this->m_running == true) &&
     (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
    local_c8._0_8_ = 1000000000;
    boost::asio::
    basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::expires_after((basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     *)&_Var6._M_node[0x16]._M_left,(duration *)local_c8);
    ::std::__shared_ptr<libtorrent::dht::dht_tracker,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::dht::dht_tracker,void>
              ((__shared_ptr<libtorrent::dht::dht_tracker,(__gnu_cxx::_Lock_policy)2> *)local_e8,
               (__weak_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<libtorrent::dht::dht_tracker>);
    local_c8._0_8_ = connection_timeout;
    local_c8[8] = '\0';
    local_c8[9] = '\0';
    local_c8[10] = '\0';
    local_c8[0xb] = '\0';
    local_c8[0xc] = '\0';
    local_c8[0xd] = '\0';
    local_c8[0xe] = '\0';
    local_c8[0xf] = '\0';
    local_b8._M_allocated_capacity = *(undefined8 *)(_Var6._M_node + 1);
    local_b8._8_8_ = _Var6._M_node[1]._M_parent;
    if ((_Base_ptr)local_b8._8_8_ != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)((long)&((_Base_ptr)local_b8._8_8_)->_M_parent + 4);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      else {
        piVar1 = (int *)((long)&((_Base_ptr)local_b8._8_8_)->_M_parent + 4);
        *piVar1 = *piVar1 + 1;
      }
    }
    local_a8._M_head_impl = (digest32<160L> *)local_e8._0_8_;
    _Stack_a0._M_head_impl = (session_settings *)local_e8._8_8_;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    boost::asio::detail::
    deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
    ::
    async_wait<std::_Bind<void(libtorrent::dht::dht_tracker::*(std::shared_ptr<libtorrent::dht::dht_tracker>,libtorrent::aux::listen_socket_handle,std::_Placeholder<1>))(libtorrent::aux::listen_socket_handle_const&,boost::system::error_code_const&)>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              ((deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
                *)_Var6._M_node[0x16]._M_left,(implementation_type *)&_Var6._M_node[0x16]._M_right,
               (_Bind<void_(libtorrent::dht::dht_tracker::*(std::shared_ptr<libtorrent::dht::dht_tracker>,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>))(const_libtorrent::aux::listen_socket_handle_&,_const_boost::system::error_code_&)>
                *)local_c8,
               (any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>
                *)&_Var6._M_node[0x18]._M_left);
    if (_Stack_a0._M_head_impl != (session_settings *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_a0._M_head_impl);
    }
    if ((_Base_ptr)local_b8._8_8_ != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)(local_b8._8_8_ + 0xc);
        iVar5 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = *(int *)(local_b8._8_8_ + 0xc);
        *(int *)(local_b8._8_8_ + 0xc) = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (*(code *)(*(dht_observer **)local_b8._8_8_)[3].super_dht_logger._vptr_dht_logger)();
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
    }
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = (pointer)0x0;
    local_e8._16_8_ = 0;
    local_b8._M_allocated_capacity = 0;
    local_b8._8_8_ = (dht_observer **)0x0;
    local_c8._0_8_ = 0;
    local_c8[8] = '\0';
    local_c8[9] = '\0';
    local_c8[10] = '\0';
    local_c8[0xb] = '\0';
    local_c8[0xc] = '\0';
    local_c8[0xd] = '\0';
    local_c8[0xe] = '\0';
    local_c8[0xf] = '\0';
    dht::node::bootstrap
              ((node *)&_Var6._M_node[1]._M_left,
               (vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                *)local_e8,(nodes_callback *)local_c8);
    if ((code *)local_b8._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_b8._M_allocated_capacity)(local_c8,local_c8,3);
    }
    if ((pointer)local_e8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ - local_e8._0_8_);
    }
  }
  return;
}

Assistant:

void dht_tracker::new_socket(aux::listen_socket_handle const& s)
	{
		address const local_address = s.get_local_endpoint().address();
		auto stored_nid = std::find_if(m_state.nids.begin(), m_state.nids.end()
			, [&](node_ids_t::value_type const& nid) { return nid.first == local_address; });
		node_id const nid = stored_nid != m_state.nids.end() ? stored_nid->second : node_id();
		// must use piecewise construction because tracker_node::connection_timer
		// is neither copyable nor movable
		auto n = m_nodes.emplace(std::piecewise_construct_t(), std::forward_as_tuple(s)
			, std::forward_as_tuple(m_ioc
			, s, this, m_settings, nid, m_log, m_counters
			, std::bind(&dht_tracker::get_node, this, _1, _2)
			, m_storage));

		update_storage_node_ids();

#ifndef TORRENT_DISABLE_LOGGING
		if (m_log->should_log(dht_logger::tracker))
		{
			m_log->log(dht_logger::tracker, "starting %s DHT tracker with node id: %s"
				, local_address.to_string().c_str()
				, aux::to_hex(n.first->second.dht.nid()).c_str());
		}
#endif

		if (m_running && n.second)
		{
			ADD_OUTSTANDING_ASYNC("dht_tracker::connection_timeout");
			n.first->second.connection_timer.expires_after(seconds(1));
			n.first->second.connection_timer.async_wait(
				std::bind(&dht_tracker::connection_timeout, self(), n.first->first, _1));
			n.first->second.dht.bootstrap({}, find_data::nodes_callback());
		}
	}